

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData *
cfd::core::CalculateRangeProof
          (ByteData *__return_storage_ptr__,uint64_t value,Pubkey *pubkey,Privkey *privkey,
          ConfidentialAssetId *asset,vector<unsigned_char,_std::allocator<unsigned_char>_> *abf,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbf,Script *script,
          int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *range_proof)

{
  ulong uVar1;
  bool bVar2;
  uchar *puVar3;
  size_type sVar4;
  uchar *puVar5;
  size_type sVar6;
  uchar *puVar7;
  size_type sVar8;
  CfdException *pCVar9;
  const_reference this;
  ScriptOperator *this_00;
  uchar *puVar10;
  size_type sVar11;
  uchar *puVar12;
  size_type sVar13;
  uchar *puVar14;
  size_type sVar15;
  uchar *puVar16;
  size_type sVar17;
  uchar *puVar18;
  size_type sVar19;
  uchar *bytes_out;
  size_type len;
  allocator local_2e1;
  string local_2e0;
  CfdSourceLocation local_2c0;
  ByteData local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey_byte;
  string local_268;
  CfdSourceLocation local_248;
  undefined1 local_22a;
  allocator local_229;
  string local_228;
  CfdSourceLocation local_208;
  ulong local_1f0;
  int64_t min_range_value;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_1d0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *script_item;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *privkey_byte;
  size_t size;
  string local_148;
  CfdSourceLocation local_128;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  CfdSourceLocation local_e8;
  int local_cc;
  undefined1 local_c8 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *asset_bytes;
  allocator<unsigned_char> local_79;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *abf_local;
  ConfidentialAssetId *asset_local;
  Privkey *privkey_local;
  Pubkey *pubkey_local;
  uint64_t value_local;
  
  generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)abf;
  ::std::allocator<unsigned_char>::allocator(&local_79);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,0x21,&local_79);
  ::std::allocator<unsigned_char>::~allocator(&local_79);
  ConfidentialAssetId::GetUnblindedData((ByteData *)local_c8,asset);
  ByteData::GetBytes(&local_b0,(ByteData *)local_c8);
  ByteData::~ByteData((ByteData *)local_c8);
  local_98 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0;
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
  puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  local_cc = wally_asset_generator_from_bytes(puVar3,sVar4,puVar5,sVar6,puVar7,sVar8);
  if (local_cc != 0) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x7f;
    local_e8.funcname = "CalculateRangeProof";
    logger::warn<int&>(&local_e8,"wally_asset_generator_from_bytes NG[{}].",&local_cc);
    local_10a = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_108,"output asset generator error.",&local_109);
    CfdException::CfdException(pCVar9,kCfdIllegalStateError,&local_108);
    local_10a = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment,0x21);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
  puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
  sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
  local_cc = wally_asset_value_commitment(value,puVar3,sVar4,puVar5,sVar6,puVar7,sVar8);
  if (local_cc != 0) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x88;
    local_128.funcname = "CalculateRangeProof";
    logger::warn<int&>(&local_128,"wally_asset_value_commitment NG[{}].",&local_cc);
    size._6_1_ = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_148,"calc asset commitment error.",(allocator *)((long)&size + 7));
    CfdException::CfdException(pCVar9,kCfdIllegalStateError,&local_148);
    size._6_1_ = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof,0x140e);
  privkey_byte = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  Privkey::GetData((ByteData *)&script_byte,privkey);
  ByteData::GetBytes(&local_178,(ByteData *)&script_byte);
  ByteData::~ByteData((ByteData *)&script_byte);
  local_160 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178;
  Script::GetData((ByteData *)&script_item,script);
  ByteData::GetBytes(&local_1b0,(ByteData *)&script_item);
  ByteData::~ByteData((ByteData *)&script_item);
  local_198 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0;
  Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &min_range_value,script);
  local_1d0 = (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
              &min_range_value;
  local_1f0 = minimum_range_value;
  bVar2 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::empty
                    (local_1d0);
  if (!bVar2) {
    this = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
           operator[](local_1d0,0);
    this_00 = ScriptElement::GetOpCode(this);
    bVar2 = ScriptOperator::operator==(this_00,(ScriptOperator *)ScriptOperator::OP_RETURN);
    if ((!bVar2) &&
       (sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_198),
       sVar4 < 0x2711)) {
      if (value == 0) {
        local_208.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_208.filename = local_208.filename + 1;
        local_208.line = 0x9b;
        local_208.funcname = "CalculateRangeProof";
        logger::warn<>(&local_208,
                       "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                      );
        local_22a = 1;
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_228,
                   "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                   ,&local_229);
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_228);
        local_22a = 0;
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_0061e6c1;
    }
  }
  local_1f0 = 0;
LAB_0061e6c1:
  if (value < local_1f0) {
    local_248.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_248.filename = local_248.filename + 1;
    local_248.line = 0xa5;
    local_248.funcname = "CalculateRangeProof";
    logger::warn<>(&local_248,"amount less than minimumRangeValue");
    pubkey_byte._6_1_ = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_268,"The amount is less than the minimumRangeValue.",
               (allocator *)((long)&pubkey_byte + 7));
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,&local_268);
    pubkey_byte._6_1_ = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (pubkey == (Pubkey *)0x0) {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_160);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_160);
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    sVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    puVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    sVar13 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    puVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_198);
    sVar15 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_198);
    puVar16 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    sVar17 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    uVar1 = local_1f0;
    puVar18 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    sVar19 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    local_cc = wally_asset_rangeproof_with_nonce
                         (value,puVar3,sVar4,puVar5,sVar6,puVar7,sVar8,puVar10,sVar11,puVar12,sVar13
                          ,puVar14,sVar15,puVar16,sVar17,uVar1,exponent,minimum_bits,puVar18,sVar19,
                          (size_t *)&privkey_byte);
  }
  else {
    Pubkey::GetData(&local_2a8,pubkey);
    ByteData::GetBytes(&local_290,&local_2a8);
    ByteData::~ByteData(&local_2a8);
    local_278 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290;
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_278);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_278);
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_160);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_160);
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_98);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_98);
    puVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    sVar13 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)vbf);
    puVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    sVar15 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)commitment);
    puVar16 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_198);
    sVar17 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_198);
    puVar18 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    sVar19 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    uVar1 = local_1f0;
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof);
    local_cc = wally_asset_rangeproof
                         (value,puVar3,sVar4,puVar5,sVar6,puVar7,sVar8,puVar10,sVar11,puVar12,sVar13
                          ,puVar14,sVar15,puVar16,sVar17,puVar18,sVar19,uVar1,exponent,minimum_bits,
                          bytes_out,len,(size_t *)&privkey_byte);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290);
  }
  if (local_cc == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)range_proof,
               (size_type)privkey_byte);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &min_range_value);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    return __return_storage_ptr__;
  }
  local_2c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_2c0.filename = local_2c0.filename + 1;
  local_2c0.line = 0xbf;
  local_2c0.funcname = "CalculateRangeProof";
  logger::warn<int&>(&local_2c0,"wally_asset_rangeproof NG[{}].",&local_cc);
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2e0,"calc asset rangeproof error.",&local_2e1);
  CfdException::CfdException(pCVar9,kCfdIllegalStateError,&local_2e0);
  __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static ByteData CalculateRangeProof(
    const uint64_t value, const Pubkey *pubkey, const Privkey &privkey,
    const ConfidentialAssetId &asset, const std::vector<uint8_t> &abf,
    const std::vector<uint8_t> &vbf, const Script &script,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<uint8_t> *commitment, std::vector<uint8_t> *range_proof) {
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  const std::vector<uint8_t> &asset_bytes =
      asset.GetUnblindedData().GetBytes();
  int ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), abf.data(), abf.size(),
      generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "output asset generator error.");
  }

  commitment->resize(ASSET_COMMITMENT_LEN);
  ret = wally_asset_value_commitment(
      value, vbf.data(), vbf.size(), generator.data(), generator.size(),
      commitment->data(), commitment->size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_value_commitment NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset commitment error.");
  }
  // info(
  //    CFD_LOG_SOURCE, "generator=[{}] commitment=[{}]",
  //    ByteData(generator).GetHex(), ByteData(commitment).GetHex());

  range_proof->resize(ASSET_RANGEPROOF_MAX_LEN);
  size_t size = 0;
  const std::vector<uint8_t> &privkey_byte = privkey.GetData().GetBytes();
  const std::vector<uint8_t> &script_byte = script.GetData().GetBytes();
  const std::vector<ScriptElement> &script_item = script.GetElementList();
  int64_t min_range_value = minimum_range_value;
  if (script_item.empty() ||
      (script_item[0].GetOpCode() == ScriptOperator::OP_RETURN) ||
      (script_byte.size() > Script::kMaxScriptSize)) {
    min_range_value = 0;
  } else if (value == 0) {
    warn(
        CFD_LOG_SOURCE,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
    throw CfdException(
        kCfdIllegalArgumentError,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
  }

  if (value < static_cast<uint64_t>(min_range_value)) {
    warn(CFD_LOG_SOURCE, "amount less than minimumRangeValue");
    throw CfdException(
        kCfdIllegalArgumentError,
        "The amount is less than the minimumRangeValue.");
  }

  if (pubkey == nullptr) {
    ret = wally_asset_rangeproof_with_nonce(
        value, privkey_byte.data(), privkey_byte.size(), asset_bytes.data(),
        asset_bytes.size(), abf.data(), abf.size(), vbf.data(), vbf.size(),
        commitment->data(), commitment->size(), script_byte.data(),
        script_byte.size(), generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  } else {
    const std::vector<uint8_t> &pubkey_byte = pubkey->GetData().GetBytes();
    ret = wally_asset_rangeproof(
        value, pubkey_byte.data(), pubkey_byte.size(), privkey_byte.data(),
        privkey_byte.size(), asset_bytes.data(), asset_bytes.size(),
        abf.data(), abf.size(), vbf.data(), vbf.size(), commitment->data(),
        commitment->size(), script_byte.data(), script_byte.size(),
        generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_rangeproof NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset rangeproof error.");
  }
  range_proof->resize(size);
  return ByteData(generator);
}